

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O2

vector<duckdb::OpenFileInfo,_true> * __thiscall
duckdb::LocalFileSystem::Glob
          (vector<duckdb::OpenFileInfo,_true> *__return_storage_ptr__,LocalFileSystem *this,
          string *path,FileOpener *opener)

{
  ulong uVar1;
  char cVar2;
  pointer pOVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  idx_t iVar7;
  reference pvVar8;
  difference_type dVar9;
  IOException *this_00;
  optional_ptr<duckdb::FileOpener,_true> opener_00;
  idx_t iVar10;
  iterator __begin5_1;
  pointer pOVar11;
  string *this_01;
  ulong uVar12;
  bool absolute_path;
  iterator __begin5;
  ulong __n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  string search_paths_str;
  string home_directory;
  vector<duckdb::OpenFileInfo,_true> previous_directories;
  string filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  search_paths;
  LogicalType local_128;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (path->_M_string_length == 0) {
    (__return_storage_ptr__->
    super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
    super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
    super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
    super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  splits.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  splits.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  splits.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::string::string((string *)&local_d0,(string *)path);
  ::std::__cxx11::string::string((string *)&local_f0,"file:/",(allocator *)&home_directory);
  bVar4 = StringUtil::StartsWith(&local_d0,&local_f0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&local_d0);
  iVar7 = GetFileUrlOffset(path);
  iVar10 = 0;
LAB_0032f0d8:
  for (; iVar7 < path->_M_string_length; iVar7 = iVar7 + 1) {
    cVar2 = (path->_M_dataplus)._M_p[iVar7];
    if ((cVar2 == '/') || (cVar2 == '\\')) goto LAB_0032f0fc;
  }
  ::std::__cxx11::string::substr((ulong)&home_directory,(ulong)path);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&splits,
             &home_directory);
  ::std::__cxx11::string::~string((string *)&home_directory);
  bVar5 = FileSystem::IsPathAbsolute(&this->super_FileSystem,path);
  uVar12 = 1;
  if (!bVar5) {
    pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&splits,0);
    ::std::__cxx11::string::string((string *)&home_directory,":",(allocator *)&filename);
    bVar5 = StringUtil::Contains(pvVar8,&home_directory);
    ::std::__cxx11::string::~string((string *)&home_directory);
    if (!bVar5) {
      pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&splits,0);
      bVar5 = ::std::operator==(pvVar8,"~");
      if (bVar5) {
        FileSystem::GetHomeDirectory_abi_cxx11_(&home_directory,(FileSystem *)opener,opener_00);
        if (home_directory._M_string_length == 0) {
          bVar5 = true;
          uVar12 = 0;
        }
        else {
          pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::get<true>(&splits,0);
          ::std::__cxx11::string::_M_assign((string *)pvVar8);
          bVar5 = FileSystem::HasGlob(path);
          uVar12 = 1;
          if (bVar5) {
            bVar5 = true;
          }
          else {
            ::std::__cxx11::string::substr((ulong)&search_paths_str,(ulong)path);
            ::std::operator+(&filename,&home_directory,&search_paths_str);
            (*(this->super_FileSystem)._vptr_FileSystem[0x19])
                      (__return_storage_ptr__,this,&filename,0);
            ::std::__cxx11::string::~string((string *)&filename);
            ::std::__cxx11::string::~string((string *)&search_paths_str);
            bVar5 = false;
          }
        }
        ::std::__cxx11::string::~string((string *)&home_directory);
        if (!bVar5) goto LAB_0032f8e7;
      }
      else {
        uVar12 = 0;
      }
    }
  }
  bVar5 = FileSystem::HasGlob(path);
  absolute_path = SUB81(uVar12,0);
  if (!bVar5) {
    FetchFileWithoutGlob(__return_storage_ptr__,this,path,opener,absolute_path);
    goto LAB_0032f8e7;
  }
  previous_directories.super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  previous_directories.super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  previous_directories.super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (absolute_path == false) {
    LogicalType::LogicalType(&local_128,SQLNULL);
    Value::Value((Value *)&home_directory,&local_128);
    LogicalType::~LogicalType(&local_128);
    if (opener != (FileOpener *)0x0) {
      ::std::__cxx11::string::string
                ((string *)&filename,"file_search_path",(allocator *)&search_paths_str);
      iVar6 = (*opener->_vptr_FileOpener[3])(opener,&filename,&home_directory);
      ::std::__cxx11::string::~string((string *)&filename);
      if ((char)iVar6 != '\x03') {
        Value::ToString_abi_cxx11_(&search_paths_str,(Value *)&home_directory);
        StringUtil::Split(&search_paths,&search_paths_str,',');
        for (; search_paths.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               search_paths.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
            search_paths.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 search_paths.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1) {
          ::std::__cxx11::string::string
                    ((string *)&local_50,
                     (string *)
                     search_paths.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          OpenFileInfo::OpenFileInfo((OpenFileInfo *)&filename,&local_50);
          std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
          emplace_back<duckdb::OpenFileInfo>
                    (&previous_directories.
                      super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>,
                     (OpenFileInfo *)&filename);
          OpenFileInfo::~OpenFileInfo((OpenFileInfo *)&filename);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&search_paths);
        ::std::__cxx11::string::~string((string *)&search_paths_str);
      }
    }
    Value::~Value((Value *)&home_directory);
  }
  else {
    pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&splits,0);
    ::std::__cxx11::string::string((string *)&local_110,(string *)pvVar8);
    OpenFileInfo::OpenFileInfo((OpenFileInfo *)&home_directory,&local_110);
    std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
    emplace_back<duckdb::OpenFileInfo>
              (&previous_directories.
                super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>,
               (OpenFileInfo *)&home_directory);
    OpenFileInfo::~OpenFileInfo((OpenFileInfo *)&home_directory);
    ::std::__cxx11::string::~string((string *)&local_110);
  }
  dVar9 = ::std::
          __count_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[3]>>
                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )splits.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )splits.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                     (_Iter_equals_val<const_char[3]>)0x10175be);
  if (1 < dVar9) {
    this_00 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&home_directory,"Cannot use multiple \'**\' in one path",
               (allocator *)&filename);
    IOException::IOException(this_00,&home_directory);
    __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  __n = 1;
  if (!bVar4) {
    __n = uVar12;
  }
  do {
    uVar12 = (long)splits.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)splits.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar12 <= __n) {
      (__return_storage_ptr__->
      super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
      super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
      super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
      super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0032f8da:
      std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
                (&previous_directories.
                  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>);
LAB_0032f8e7:
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&splits);
      return __return_storage_ptr__;
    }
    pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&splits,__n);
    uVar1 = __n + 1;
    bVar4 = FileSystem::HasGlob(pvVar8);
    pOVar3 = previous_directories.
             super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
             super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl
             .super__Vector_impl_data._M_finish;
    search_paths_str._M_dataplus._M_p = (pointer)0x0;
    search_paths_str._M_string_length = 0;
    search_paths_str.field_2._M_allocated_capacity = 0;
    if (bVar4) {
      pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&splits,__n);
      bVar4 = ::std::operator==(pvVar8,"**");
      pOVar3 = previous_directories.
               super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
               super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (bVar4) {
        if (uVar1 != uVar12) {
          std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::operator=
                    ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                     &search_paths_str,
                     &previous_directories.
                      super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>);
        }
        pOVar3 = previous_directories.
                 super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pOVar11 = previous_directories.
                  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (previous_directories.
            super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
            super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
            super__Vector_impl_data._M_start ==
            previous_directories.
            super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
            super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          ::std::__cxx11::string::string((string *)&home_directory,".",(allocator *)&filename);
          RecursiveGlobDirectories
                    (&this->super_FileSystem,&home_directory,
                     (vector<duckdb::OpenFileInfo,_true> *)&search_paths_str,uVar1 != uVar12,false);
LAB_0032f836:
          this_01 = &home_directory;
          goto LAB_0032f839;
        }
        for (; pOVar11 != pOVar3; pOVar11 = pOVar11 + 1) {
          RecursiveGlobDirectories
                    (&this->super_FileSystem,&pOVar11->path,
                     (vector<duckdb::OpenFileInfo,_true> *)&search_paths_str,uVar1 != uVar12,true);
        }
      }
      else {
        pOVar11 = previous_directories.
                  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (previous_directories.
            super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
            super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
            super__Vector_impl_data._M_start ==
            previous_directories.
            super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
            super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          ::std::__cxx11::string::string((string *)&home_directory,".",(allocator *)&filename);
          pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::get<true>(&splits,__n);
          GlobFilesInternal(&this->super_FileSystem,&home_directory,pvVar8,uVar1 != uVar12,
                            (vector<duckdb::OpenFileInfo,_true> *)&search_paths_str,false);
          goto LAB_0032f836;
        }
        for (; pOVar11 != pOVar3; pOVar11 = pOVar11 + 1) {
          pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::get<true>(&splits,__n);
          GlobFilesInternal(&this->super_FileSystem,&pOVar11->path,pvVar8,uVar1 != uVar12,
                            (vector<duckdb::OpenFileInfo,_true> *)&search_paths_str,true);
        }
      }
    }
    else {
      if (previous_directories.
          super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
          super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
          super__Vector_impl_data._M_start !=
          previous_directories.
          super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
          super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pOVar11 = previous_directories.
                  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (uVar1 == uVar12) {
          for (; pOVar11 != pOVar3; pOVar11 = pOVar11 + 1) {
            pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::get<true>(&splits,__n);
            FileSystem::JoinPath(&filename,&this->super_FileSystem,&pOVar11->path,pvVar8);
            iVar6 = (*(this->super_FileSystem)._vptr_FileSystem[0x12])(this,&filename,opener);
            if (((char)iVar6 != '\0') ||
               (iVar6 = (*(this->super_FileSystem)._vptr_FileSystem[0xd])(this,&filename,opener),
               (char)iVar6 != '\0')) {
              ::std::__cxx11::string::string((string *)&local_90,(string *)&filename);
              OpenFileInfo::OpenFileInfo((OpenFileInfo *)&home_directory,&local_90);
              std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
              emplace_back<duckdb::OpenFileInfo>
                        ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                         &search_paths_str,(OpenFileInfo *)&home_directory);
              OpenFileInfo::~OpenFileInfo((OpenFileInfo *)&home_directory);
              ::std::__cxx11::string::~string((string *)&local_90);
            }
            ::std::__cxx11::string::~string((string *)&filename);
          }
        }
        else {
          for (; pOVar11 != pOVar3; pOVar11 = pOVar11 + 1) {
            pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::get<true>(&splits,__n);
            FileSystem::JoinPath(&local_b0,&this->super_FileSystem,&pOVar11->path,pvVar8);
            OpenFileInfo::OpenFileInfo((OpenFileInfo *)&home_directory,&local_b0);
            std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
            emplace_back<duckdb::OpenFileInfo>
                      ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                       &search_paths_str,(OpenFileInfo *)&home_directory);
            OpenFileInfo::~OpenFileInfo((OpenFileInfo *)&home_directory);
            ::std::__cxx11::string::~string((string *)&local_b0);
          }
        }
        goto LAB_0032f83e;
      }
      pvVar8 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&splits,__n);
      ::std::__cxx11::string::string((string *)&local_70,(string *)pvVar8);
      OpenFileInfo::OpenFileInfo((OpenFileInfo *)&home_directory,&local_70);
      std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
      emplace_back<duckdb::OpenFileInfo>
                ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                 &search_paths_str,(OpenFileInfo *)&home_directory);
      OpenFileInfo::~OpenFileInfo((OpenFileInfo *)&home_directory);
      this_01 = &local_70;
LAB_0032f839:
      ::std::__cxx11::string::~string((string *)this_01);
    }
LAB_0032f83e:
    if (search_paths_str._M_dataplus._M_p == (pointer)search_paths_str._M_string_length) {
      FetchFileWithoutGlob(__return_storage_ptr__,this,path,opener,absolute_path);
LAB_0032f8d0:
      std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
                ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                 &search_paths_str);
      goto LAB_0032f8da;
    }
    if (uVar1 == uVar12) {
      (__return_storage_ptr__->
      super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
      super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)search_paths_str._M_dataplus._M_p;
      (__return_storage_ptr__->
      super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
      super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)search_paths_str._M_string_length;
      (__return_storage_ptr__->
      super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
      super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)search_paths_str.field_2._M_allocated_capacity;
      search_paths_str._M_dataplus._M_p = (pointer)0x0;
      search_paths_str._M_string_length = 0;
      search_paths_str.field_2._M_allocated_capacity = 0;
      goto LAB_0032f8d0;
    }
    std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::_M_move_assign
              (&previous_directories.
                super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>,
               &search_paths_str);
    std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
              ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
               &search_paths_str);
    __n = uVar1;
  } while( true );
LAB_0032f0fc:
  if (iVar7 != iVar10) {
    if (splits.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        splits.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::__cxx11::string::substr((ulong)&home_directory,(ulong)path);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&splits,
                 &home_directory);
    }
    else {
      ::std::__cxx11::string::substr((ulong)&home_directory,(ulong)path);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&splits,
                 &home_directory);
    }
    ::std::__cxx11::string::~string((string *)&home_directory);
  }
  iVar10 = iVar7 + 1;
  iVar7 = iVar10;
  goto LAB_0032f0d8;
}

Assistant:

vector<OpenFileInfo> LocalFileSystem::Glob(const string &path, FileOpener *opener) {
	if (path.empty()) {
		return vector<OpenFileInfo>();
	}
	// split up the path into separate chunks
	vector<string> splits;

	bool is_file_url = StringUtil::StartsWith(path, "file:/");
	idx_t file_url_path_offset = GetFileUrlOffset(path);

	idx_t last_pos = 0;
	for (idx_t i = file_url_path_offset; i < path.size(); i++) {
		if (path[i] == '\\' || path[i] == '/') {
			if (i == last_pos) {
				// empty: skip this position
				last_pos = i + 1;
				continue;
			}
			if (splits.empty()) {
				//				splits.push_back(path.substr(file_url_path_offset, i-file_url_path_offset));
				splits.push_back(path.substr(0, i));
			} else {
				splits.push_back(path.substr(last_pos, i - last_pos));
			}
			last_pos = i + 1;
		}
	}
	splits.push_back(path.substr(last_pos, path.size() - last_pos));
	// handle absolute paths
	bool absolute_path = false;
	if (IsPathAbsolute(path)) {
		// first character is a slash -  unix absolute path
		absolute_path = true;
	} else if (StringUtil::Contains(splits[0], ":")) { // TODO: this is weird? shouldn't IsPathAbsolute handle this?
		// first split has a colon -  windows absolute path
		absolute_path = true;
	} else if (splits[0] == "~") {
		// starts with home directory
		auto home_directory = GetHomeDirectory(opener);
		if (!home_directory.empty()) {
			absolute_path = true;
			splits[0] = home_directory;
			D_ASSERT(path[0] == '~');
			if (!HasGlob(path)) {
				return Glob(home_directory + path.substr(1));
			}
		}
	}
	// Check if the path has a glob at all
	if (!HasGlob(path)) {
		// no glob: return only the file (if it exists or is a pipe)
		return FetchFileWithoutGlob(path, opener, absolute_path);
	}
	vector<OpenFileInfo> previous_directories;
	if (absolute_path) {
		// for absolute paths, we don't start by scanning the current directory
		previous_directories.push_back(splits[0]);
	} else {
		// If file_search_path is set, use those paths as the first glob elements
		Value value;
		if (opener && opener->TryGetCurrentSetting("file_search_path", value)) {
			auto search_paths_str = value.ToString();
			vector<std::string> search_paths = StringUtil::Split(search_paths_str, ',');
			for (const auto &search_path : search_paths) {
				previous_directories.push_back(search_path);
			}
		}
	}

	if (HasMultipleCrawl(splits)) {
		throw IOException("Cannot use multiple \'**\' in one path");
	}

	idx_t start_index;
	if (is_file_url) {
		start_index = 1;
	} else if (absolute_path) {
		start_index = 1;
	} else {
		start_index = 0;
	}

	for (idx_t i = start_index ? 1 : 0; i < splits.size(); i++) {
		bool is_last_chunk = i + 1 == splits.size();
		bool has_glob = HasGlob(splits[i]);
		// if it's the last chunk we need to find files, otherwise we find directories
		// not the last chunk: gather a list of all directories that match the glob pattern
		vector<OpenFileInfo> result;
		if (!has_glob) {
			// no glob, just append as-is
			if (previous_directories.empty()) {
				result.push_back(splits[i]);
			} else {
				if (is_last_chunk) {
					for (auto &prev_directory : previous_directories) {
						const string filename = JoinPath(prev_directory.path, splits[i]);
						if (FileExists(filename, opener) || DirectoryExists(filename, opener)) {
							result.push_back(filename);
						}
					}
				} else {
					for (auto &prev_directory : previous_directories) {
						result.push_back(JoinPath(prev_directory.path, splits[i]));
					}
				}
			}
		} else {
			if (IsCrawl(splits[i])) {
				if (!is_last_chunk) {
					result = previous_directories;
				}
				if (previous_directories.empty()) {
					RecursiveGlobDirectories(*this, ".", result, !is_last_chunk, false);
				} else {
					for (auto &prev_dir : previous_directories) {
						RecursiveGlobDirectories(*this, prev_dir.path, result, !is_last_chunk, true);
					}
				}
			} else {
				if (previous_directories.empty()) {
					// no previous directories: list in the current path
					GlobFilesInternal(*this, ".", splits[i], !is_last_chunk, result, false);
				} else {
					// previous directories
					// we iterate over each of the previous directories, and apply the glob of the current directory
					for (auto &prev_directory : previous_directories) {
						GlobFilesInternal(*this, prev_directory.path, splits[i], !is_last_chunk, result, true);
					}
				}
			}
		}
		if (result.empty()) {
			// no result found that matches the glob
			// last ditch effort: search the path as a string literal
			return FetchFileWithoutGlob(path, opener, absolute_path);
		}
		if (is_last_chunk) {
			return result;
		}
		previous_directories = std::move(result);
	}
	return vector<OpenFileInfo>();
}